

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result(Expression_lhs<const_int_&> *this)

{
  uint uVar1;
  ContextOptions *pCVar2;
  undefined8 *in_RSI;
  Result *in_RDI;
  bool res;
  undefined1 in_stack_ffffffffffffff6f;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffffbc;
  bool local_11;
  
  local_11 = *(int *)*in_RSI != 0;
  if ((*(uint *)(in_RSI + 1) & 0x100) != 0) {
    local_11 = (bool)((local_11 ^ 0xffU) & 1);
  }
  if ((local_11 != false) && (pCVar2 = getContextOptions(), (pCVar2->success & 1U) == 0)) {
    uVar1 = (uint)local_11;
    String::String((String *)0x13f836);
    Result::Result((Result *)CONCAT44(uVar1,in_stack_ffffffffffffff70),
                   (bool)in_stack_ffffffffffffff6f,(String *)0x13f84c);
    String::~String((String *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    return in_RDI;
  }
  uVar1 = (uint)local_11;
  doctest::toString(in_stack_ffffffffffffffbc);
  Result::Result((Result *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (bool)in_stack_ffffffffffffff6f,(String *)0x13f7f3);
  String::~String((String *)CONCAT44(uVar1,in_stack_ffffffffffffff80));
  return in_RDI;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
                DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
                bool res = static_cast<bool>(lhs);
                DOCTEST_MSVC_SUPPRESS_WARNING_POP
                if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                    res = !res;

                if(!res || getContextOptions()->success)
                    return Result(res, toString(lhs));
                return Result(res);
            }